

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O3

void __thiscall
node::BlockManager::BlockManager(BlockManager *this,SignalInterrupt *interrupt,Options opts)

{
  _Rb_tree_header *p_Var1;
  path *this_00;
  byte *pbVar2;
  byte *pbVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  string_view source_file;
  path dir;
  path dir_00;
  char cVar7;
  long lVar8;
  Logger *pLVar9;
  runtime_error *this_01;
  size_t in_RCX;
  undefined8 *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  long in_FS_OFFSET;
  bool bVar10;
  Span<std::byte> output;
  Span<const_unsigned_char> s;
  string_view str;
  Span<const_unsigned_char> s_00;
  string_view logging_function;
  path xor_key_path;
  array<std::byte,_8UL> xor_key;
  string log_msg;
  undefined8 in_stack_fffffffffffffda8;
  char *in_stack_fffffffffffffdb0;
  undefined8 in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdc0;
  undefined1 in_stack_fffffffffffffdc4 [12];
  path local_220;
  path local_1f8;
  string local_1d0;
  long *local_1b0 [2];
  long local_1a0 [2];
  path local_190;
  FastRandomContext local_168;
  byte local_e0 [72];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_78;
  undefined1 local_58 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined8 *)
   ((long)&(this->cs_LastBlockFile).super_recursive_mutex.super___recursive_mutex_base._M_mutex +
   0x10) = 0;
  (this->cs_LastBlockFile).super_recursive_mutex.super___recursive_mutex_base._M_mutex.__data.__list
  .__prev = (__pthread_internal_list *)0x0;
  (this->cs_LastBlockFile).super_recursive_mutex.super___recursive_mutex_base._M_mutex.__data.__list
  .__next = (__pthread_internal_list *)0x0;
  (this->cs_LastBlockFile).super_recursive_mutex.super___recursive_mutex_base._M_mutex.__align = 0;
  *(undefined8 *)
   ((long)&(this->cs_LastBlockFile).super_recursive_mutex.super___recursive_mutex_base._M_mutex + 8)
       = 0;
  (this->cs_LastBlockFile).super_recursive_mutex.super___recursive_mutex_base._M_mutex.__data.__kind
       = 1;
  (this->m_blockfile_info).super__Vector_base<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_blockfile_info).super__Vector_base<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_blockfile_info).super__Vector_base<CBlockFileInfo,_std::allocator<CBlockFileInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_blockfile_cursors)._M_elems[0].super__Optional_base<node::BlockfileCursor,_true,_true>.
  _M_payload.super__Optional_payload_base<node::BlockfileCursor>._M_payload =
       (_Storage<node::BlockfileCursor,_true>)0x0;
  *(undefined8 *)
   &(this->m_blockfile_cursors)._M_elems[0].super__Optional_base<node::BlockfileCursor,_true,_true>.
    _M_payload.super__Optional_payload_base<node::BlockfileCursor>._M_engaged = 1;
  *(undefined8 *)
   ((long)&(this->m_blockfile_cursors)._M_elems[1].
           super__Optional_base<node::BlockfileCursor,_true,_true>._M_payload.
           super__Optional_payload_base<node::BlockfileCursor>._M_payload + 4) = 0;
  this->m_check_for_pruning = false;
  this->m_prune_mode = in_RDX[2] != 0;
  local_e0[0] = 0;
  local_e0[1] = 0;
  local_e0[2] = 0;
  local_e0[3] = 0;
  local_e0[4] = 0;
  local_e0[5] = 0;
  local_e0[6] = 0;
  local_e0[7] = 0;
  if ((*(char *)(in_RDX + 1) == '\x01') &&
     (cVar7 = std::filesystem::is_empty((path *)(in_RDX + 4)), cVar7 != '\0')) {
    FastRandomContext::FastRandomContext(&local_168,false);
    output.m_size = 8;
    output.m_data = local_e0;
    FastRandomContext::fillrand(&local_168,output);
    ChaCha20::~ChaCha20(&local_168.rng);
  }
  std::filesystem::__cxx11::path::path(&local_190,(path *)(in_RDX + 4));
  std::filesystem::__cxx11::path::_M_append(&local_190,7,"xor.dat");
  std::filesystem::__cxx11::path::path((path *)&local_168,&local_190);
  std::filesystem::__cxx11::path::~path(&local_190);
  cVar7 = std::filesystem::status((path *)&local_168);
  if ((cVar7 == '\0') || (cVar7 == -1)) {
    local_58._0_8_ = fsbridge::fopen((char *)&local_168,"wbx");
    local_58._8_8_ = (pointer)0x0;
    local_58._16_8_ = (pointer)0x0;
    local_58._24_8_ = (pointer)0x0;
    AutoFile::write((AutoFile *)local_58,(int)local_e0,&DAT_00000008,in_RCX);
  }
  else {
    local_58._0_8_ = fsbridge::fopen((char *)&local_168,"rb");
    local_58._8_8_ = (pointer)0x0;
    local_58._16_8_ = (pointer)0x0;
    local_58._24_8_ = (pointer)0x0;
    AutoFile::read((AutoFile *)local_58,(int)local_e0,&DAT_00000008,in_RCX);
  }
  AutoFile::~AutoFile((AutoFile *)local_58);
  if (*(char *)(in_RDX + 1) == '\0') {
    local_58._0_8_ = (FILE *)0x0;
    lVar8 = 0;
    do {
      pbVar2 = local_e0 + lVar8;
      pbVar3 = local_58 + lVar8;
      if (*pbVar2 != *pbVar3) break;
      bVar10 = lVar8 != 7;
      lVar8 = lVar8 + 1;
    } while (bVar10);
    if (*pbVar2 != *pbVar3) {
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      s_00.m_size = 8;
      s_00.m_data = local_e0;
      HexStr_abi_cxx11_(&local_78,s_00);
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_98,local_168.super_RandomMixin<FastRandomContext>.bitbuf,
                 local_168.super_RandomMixin<FastRandomContext>.bitbuf +
                 local_168.super_RandomMixin<FastRandomContext>._8_8_);
      tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                ((string *)local_58,
                 (tinyformat *)
                 "The blocksdir XOR-key can not be disabled when a random key was already stored! Stored key: \'%s\', stored path: \'%s\'."
                 ,(char *)&local_78,&local_98,in_R8);
      std::runtime_error::runtime_error(this_01,(string *)local_58);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_00214400;
    }
  }
  local_1b0[0] = local_1a0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1b0,in_RDX[4],in_RDX[5] + in_RDX[4]);
  s.m_size = 8;
  s.m_data = local_e0;
  HexStr_abi_cxx11_(&local_1d0,s);
  pLVar9 = LogInstance();
  bVar10 = BCLog::Logger::Enabled(pLVar9);
  if (bVar10) {
    local_58._0_8_ = local_58 + 0x10;
    local_58._8_8_ = (pointer)0x0;
    local_58._16_8_ = local_58._16_8_ & 0xffffffffffffff00;
    tinyformat::format<std::__cxx11::string,std::__cxx11::string>
              (&local_78,
               (tinyformat *)"Using obfuscation key for blocksdir *.dat files (%s): \'%s\'\n",
               (char *)local_1b0,&local_1d0,in_R8);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
               &local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    pLVar9 = LogInstance();
    local_78._M_dataplus._M_p = (pointer)0x5e;
    local_78._M_string_length = 0x801f09;
    in_stack_fffffffffffffda8 = 0x5e;
    in_stack_fffffffffffffdb0 =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/blockstorage.cpp"
    ;
    in_stack_fffffffffffffdc0 = 2;
    in_stack_fffffffffffffdb8 = 0xffffffffffffffff;
    source_file._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/blockstorage.cpp"
    ;
    source_file._M_len = 0x5e;
    str._M_str = (char *)local_58._0_8_;
    str._M_len = local_58._8_8_;
    logging_function._M_str = "InitBlocksdirXorKey";
    logging_function._M_len = 0x13;
    BCLog::Logger::LogPrintStr(pLVar9,str,logging_function,source_file,0x4a0,ALL,Info);
    if ((FILE *)local_58._0_8_ != (FILE *)(local_58 + 0x10)) {
      operator_delete((void *)local_58._0_8_,(ulong)(local_58._16_8_ + 1));
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  if (local_1b0[0] != local_1a0) {
    operator_delete(local_1b0[0],local_1a0[0] + 1);
  }
  std::vector<std::byte,std::allocator<std::byte>>::vector<std::byte*,void>
            ((vector<std::byte,std::allocator<std::byte>> *)&this->m_xor_key,local_e0,local_e0 + 8,
             (allocator_type *)local_58);
  std::filesystem::__cxx11::path::~path((path *)&local_168);
  p_Var1 = &(this->m_dirty_blockindex)._M_t._M_impl.super__Rb_tree_header;
  (this->m_dirty_blockindex)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_dirty_blockindex)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->m_dirty_blockindex)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_dirty_blockindex)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_dirty_blockindex)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_dirty_fileinfo)._M_t._M_impl.super__Rb_tree_header;
  (this->m_dirty_fileinfo)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_dirty_fileinfo)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_dirty_fileinfo)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->m_dirty_fileinfo)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_dirty_fileinfo)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_prune_locks)._M_h._M_buckets = &(this->m_prune_locks)._M_h._M_single_bucket;
  (this->m_prune_locks)._M_h._M_bucket_count = 1;
  (this->m_prune_locks)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_prune_locks)._M_h._M_element_count = 0;
  (this->m_prune_locks)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_prune_locks)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_prune_locks)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  uVar4 = in_RDX[1];
  uVar5 = *(undefined8 *)((long)in_RDX + 9);
  uVar6 = *(undefined8 *)((long)in_RDX + 0x11);
  (this->m_opts).chainparams = (CChainParams *)*in_RDX;
  *(undefined8 *)&(this->m_opts).use_xor = uVar4;
  *(undefined8 *)&(this->m_opts).field_0x9 = uVar5;
  *(undefined8 *)((long)&(this->m_opts).prune_target + 1) = uVar6;
  this_00 = &(this->m_opts).blocks_dir;
  std::filesystem::__cxx11::path::path(&this_00->super_path,(path *)(in_RDX + 4));
  (this->m_opts).notifications = (Notifications *)in_RDX[9];
  std::filesystem::__cxx11::path::path(&local_1f8,&this_00->super_path);
  dir.super_path._M_pathname._M_string_length = (size_type)in_stack_fffffffffffffdb0;
  dir.super_path._M_pathname._M_dataplus._M_p = (pointer)in_stack_fffffffffffffda8;
  dir.super_path._M_pathname.field_2._M_allocated_capacity = in_stack_fffffffffffffdb8;
  dir.super_path._M_pathname.field_2._8_4_ = in_stack_fffffffffffffdc0;
  dir.super_path._28_12_ = in_stack_fffffffffffffdc4;
  FlatFileSeq::FlatFileSeq(&this->m_block_file_seq,dir,(char *)&local_1f8,0x838f5d);
  std::filesystem::__cxx11::path::~path(&local_1f8);
  std::filesystem::__cxx11::path::path(&local_220,&this_00->super_path);
  dir_00.super_path._M_pathname._M_string_length = (size_type)in_stack_fffffffffffffdb0;
  dir_00.super_path._M_pathname._M_dataplus._M_p = (pointer)in_stack_fffffffffffffda8;
  dir_00.super_path._M_pathname.field_2._M_allocated_capacity = in_stack_fffffffffffffdb8;
  dir_00.super_path._M_pathname.field_2._8_4_ = in_stack_fffffffffffffdc0;
  dir_00.super_path._28_12_ = in_stack_fffffffffffffdc4;
  FlatFileSeq::FlatFileSeq(&this->m_undo_file_seq,dir_00,(char *)&local_220,0x82a492);
  std::filesystem::__cxx11::path::~path(&local_220);
  this->m_interrupt = interrupt;
  this->m_importing = (__atomic_base<bool>)0x0;
  this->m_blockfiles_indexed = (__atomic_base<bool>)0x1;
  (this->m_block_index)._M_h._M_buckets = &(this->m_block_index)._M_h._M_single_bucket;
  (this->m_block_index)._M_h._M_bucket_count = 1;
  (this->m_block_index)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_block_index)._M_h._M_element_count = 0;
  (this->m_block_index)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->m_block_index)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->m_block_index)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->m_snapshot_height).super__Optional_base<int,_true,_true>._M_payload.
  super__Optional_payload_base<int>._M_engaged = false;
  p_Var1 = &(this->m_blocks_unlinked)._M_t._M_impl.super__Rb_tree_header;
  (this->m_blocks_unlinked)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_blocks_unlinked)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_blocks_unlinked)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_blocks_unlinked)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_blocks_unlinked)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_block_tree_db)._M_t.
  super___uniq_ptr_impl<kernel::BlockTreeDB,_std::default_delete<kernel::BlockTreeDB>_>._M_t.
  super__Tuple_impl<0UL,_kernel::BlockTreeDB_*,_std::default_delete<kernel::BlockTreeDB>_>.
  super__Head_base<0UL,_kernel::BlockTreeDB_*,_false>._M_head_impl = (BlockTreeDB *)0x0;
  this->m_have_pruned = false;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_00214400:
  __stack_chk_fail();
}

Assistant:

BlockManager::BlockManager(const util::SignalInterrupt& interrupt, Options opts)
    : m_prune_mode{opts.prune_target > 0},
      m_xor_key{InitBlocksdirXorKey(opts)},
      m_opts{std::move(opts)},
      m_block_file_seq{FlatFileSeq{m_opts.blocks_dir, "blk", m_opts.fast_prune ? 0x4000 /* 16kB */ : BLOCKFILE_CHUNK_SIZE}},
      m_undo_file_seq{FlatFileSeq{m_opts.blocks_dir, "rev", UNDOFILE_CHUNK_SIZE}},
      m_interrupt{interrupt} {}